

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# observer.cpp
# Opt level: O2

int main(void)

{
  BadListener bl;
  ConsoleListener cr;
  Person p;
  
  p.m_age = 10;
  p.m_mtx.super___recursive_mutex_base._M_mutex._8_8_ = 0;
  p.m_listeners.super__Vector_base<IPersonListener_*,_std::allocator<IPersonListener_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  p.m_listeners.super__Vector_base<IPersonListener_*,_std::allocator<IPersonListener_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  p.m_listeners.super__Vector_base<IPersonListener_*,_std::allocator<IPersonListener_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p.m_mtx.super___recursive_mutex_base._M_mutex.__align = 0;
  p.m_mtx.super___recursive_mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  p.m_mtx.super___recursive_mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  p.m_mtx.super___recursive_mutex_base._M_mutex._16_8_ = 1;
  cr.super_IPersonListener._vptr_IPersonListener = (IPersonListener)&PTR__IPersonListener_00104ce0;
  bl.super_IPersonListener._vptr_IPersonListener = (IPersonListener)&PTR__IPersonListener_00104d70;
  Person::subscribe(&p,&cr.super_IPersonListener);
  Person::set_age(&p,0xb);
  Person::set_age(&p,0xc);
  Person::subscribe(&p,&bl.super_IPersonListener);
  Person::set_age(&p,0xd);
  Person::unsubscribe(&p,&cr.super_IPersonListener);
  Person::set_age(&p,0x11);
  std::_Vector_base<IPersonListener_*,_std::allocator<IPersonListener_*>_>::~_Vector_base
            (&p.m_listeners.
              super__Vector_base<IPersonListener_*,_std::allocator<IPersonListener_*>_>);
  return 0;
}

Assistant:

int main()
{
	Person p(10);
	ConsoleListener cr;
	BadListener bl;
	p.subscribe(std::addressof(cr));
	p.set_age(11);
	p.set_age(12);
	p.subscribe(std::addressof(bl));
	p.set_age(13);
	p.unsubscribe(std::addressof(cr));
	p.set_age(17);

	return 0;
}